

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode Curl_ossl_seed(Curl_easy *data)

{
  char *pcVar1;
  int iVar2;
  CURLcode CVar3;
  char *file;
  long lVar4;
  long lVar5;
  uint *puVar6;
  curltime cVar7;
  curltime cVar8;
  curltime cVar9;
  curltime cVar10;
  curltime cVar11;
  char fname [256];
  ulong local_138;
  uint local_130 [64];
  
  CVar3 = CURLE_OK;
  if (Curl_ossl_seed_ssl_seeded == '\0') {
    iVar2 = RAND_status();
    CVar3 = CURLE_OK;
    if (iVar2 == 0) {
      pcVar1 = (data->set).str[0x23];
      file = "/dev/urandom";
      if (pcVar1 != (char *)0x0) {
        file = pcVar1;
      }
      RAND_load_file(file,0x400);
      iVar2 = RAND_status();
      if (iVar2 == 0) {
        do {
          lVar5 = 0x300;
          lVar4 = 4;
          puVar6 = local_130;
          do {
            cVar7 = Curl_now();
            Curl_wait_ms(1);
            cVar8 = Curl_now();
            cVar9 = Curl_now();
            cVar10 = Curl_now();
            cVar11 = Curl_now();
            *(long *)(puVar6 + -2) =
                 ((long)cVar9.tv_usec + cVar8.tv_sec) * lVar5 ^ (lVar4 + -3) * cVar7.tv_sec;
            *puVar6 = ((int)cVar10.tv_sec + cVar11.tv_usec) * (int)lVar4 * 0x10000 ^
                      ((int)lVar4 + -2) * cVar7.tv_usec;
            lVar5 = lVar5 + 0x100;
            lVar4 = lVar4 + 1;
            puVar6 = puVar6 + 4;
          } while (lVar4 != 8);
          RAND_add(&local_138,0x40,32.0);
          iVar2 = RAND_status();
        } while (iVar2 == 0);
        local_138._0_1_ = '\0';
        RAND_file_name((char *)&local_138,0x100);
        if ((char)local_138 != '\0') {
          RAND_load_file((char *)&local_138,0x400);
          iVar2 = RAND_status();
          if (iVar2 != 0) {
            return CURLE_OK;
          }
        }
        Curl_infof(data,"libcurl is now using a weak random seed!\n");
        iVar2 = RAND_status();
        CVar3 = CURLE_SSL_CONNECT_ERROR;
        if (iVar2 != 0) {
          CVar3 = CURLE_OK;
        }
      }
    }
    else {
      Curl_ossl_seed_ssl_seeded = '\x01';
    }
  }
  return CVar3;
}

Assistant:

static CURLcode Curl_ossl_seed(struct Curl_easy *data)
{
  /* we have the "SSL is seeded" boolean static to prevent multiple
     time-consuming seedings in vain */
  static bool ssl_seeded = FALSE;
  char fname[256];

  if(ssl_seeded)
    return CURLE_OK;

  if(rand_enough()) {
    /* OpenSSL 1.1.0+ will return here */
    ssl_seeded = TRUE;
    return CURLE_OK;
  }

#ifndef RANDOM_FILE
  /* if RANDOM_FILE isn't defined, we only perform this if an option tells
     us to! */
  if(data->set.str[STRING_SSL_RANDOM_FILE])
#define RANDOM_FILE "" /* doesn't matter won't be used */
#endif
  {
    /* let the option override the define */
    RAND_load_file((data->set.str[STRING_SSL_RANDOM_FILE]?
                    data->set.str[STRING_SSL_RANDOM_FILE]:
                    RANDOM_FILE),
                   RAND_LOAD_LENGTH);
    if(rand_enough())
      return CURLE_OK;
  }

#if defined(HAVE_RAND_EGD)
  /* only available in OpenSSL 0.9.5 and later */
  /* EGD_SOCKET is set at configure time or not at all */
#ifndef EGD_SOCKET
  /* If we don't have the define set, we only do this if the egd-option
     is set */
  if(data->set.str[STRING_SSL_EGDSOCKET])
#define EGD_SOCKET "" /* doesn't matter won't be used */
#endif
  {
    /* If there's an option and a define, the option overrides the
       define */
    int ret = RAND_egd(data->set.str[STRING_SSL_EGDSOCKET]?
                       data->set.str[STRING_SSL_EGDSOCKET]:EGD_SOCKET);
    if(-1 != ret) {
      if(rand_enough())
        return CURLE_OK;
    }
  }
#endif

  /* fallback to a custom seeding of the PRNG using a hash based on a current
     time */
  do {
    unsigned char randb[64];
    size_t len = sizeof(randb);
    size_t i, i_max;
    for(i = 0, i_max = len / sizeof(struct curltime); i < i_max; ++i) {
      struct curltime tv = Curl_now();
      Curl_wait_ms(1);
      tv.tv_sec *= i + 1;
      tv.tv_usec *= (unsigned int)i + 2;
      tv.tv_sec ^= ((Curl_now().tv_sec + Curl_now().tv_usec) *
                    (i + 3)) << 8;
      tv.tv_usec ^= (unsigned int) ((Curl_now().tv_sec +
                                     Curl_now().tv_usec) *
                                    (i + 4)) << 16;
      memcpy(&randb[i * sizeof(struct curltime)], &tv,
             sizeof(struct curltime));
    }
    RAND_add(randb, (int)len, (double)len/2);
  } while(!rand_enough());

  /* generates a default path for the random seed file */
  fname[0] = 0; /* blank it first */
  RAND_file_name(fname, sizeof(fname));
  if(fname[0]) {
    /* we got a file name to try */
    RAND_load_file(fname, RAND_LOAD_LENGTH);
    if(rand_enough())
      return CURLE_OK;
  }

  infof(data, "libcurl is now using a weak random seed!\n");
  return (rand_enough() ? CURLE_OK :
    CURLE_SSL_CONNECT_ERROR /* confusing error code */);
}